

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_msg_buffer-inl.h
# Opt level: O0

log_msg_buffer * __thiscall
spdlog::details::log_msg_buffer::operator=(log_msg_buffer *this,log_msg_buffer *other)

{
  char *in_RSI;
  log_msg_buffer *in_RDI;
  log_msg_buffer *unaff_retaddr;
  log_msg_buffer *begin;
  
  begin = in_RDI;
  memcpy(in_RDI,in_RSI,0x60);
  ::fmt::v6::internal::buffer<char>::clear((buffer<char> *)&in_RDI->buffer);
  ::fmt::v6::internal::buffer<char>::data((buffer<char> *)(in_RSI + 0x60));
  ::fmt::v6::internal::buffer<char>::data((buffer<char> *)(in_RSI + 0x60));
  ::fmt::v6::internal::buffer<char>::size((buffer<char> *)(in_RSI + 0x60));
  ::fmt::v6::internal::buffer<char>::append<char>
            ((buffer<char> *)unaff_retaddr,(char *)begin,in_RSI);
  update_string_views(unaff_retaddr);
  return in_RDI;
}

Assistant:

SPDLOG_INLINE log_msg_buffer &log_msg_buffer::operator=(const log_msg_buffer &other)
{
    log_msg::operator=(other);
    buffer.clear();
    buffer.append(other.buffer.data(), other.buffer.data() + other.buffer.size());
    update_string_views();
    return *this;
}